

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage
          (FileGenerator *this,int idx,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  char acVar1 [8];
  bool bVar2;
  reference pvVar3;
  pointer pMVar4;
  Descriptor *d;
  Options *in_RCX;
  Sub *local_400;
  basic_string_view<char,_std::char_traits<char>_> local_3a0;
  string_view local_388;
  undefined1 local_378 [8];
  NamespaceOpener proto_ns;
  basic_string_view<char,_std::char_traits<char>_> local_348;
  undefined1 local_331;
  anon_class_24_3_58d943a6_for_cb local_330;
  allocator<char> local_311;
  string local_310;
  anon_class_24_3_58d943a6_for_cb local_2f0;
  allocator<char> local_2d1;
  string local_2d0;
  Sub *local_2b0;
  Sub local_2a8;
  Sub local_1f0;
  iterator local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_128;
  string local_110;
  undefined1 local_f0 [16];
  undefined1 local_e0 [8];
  NamespaceOpener ns;
  undefined1 local_a8 [8];
  CrossFileReferences refs;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  undefined1 local_30 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1039:28)>
  v;
  Printer *p_local;
  FileGenerator *pFStack_10;
  int idx_local;
  FileGenerator *this_local;
  
  v.storage_.callback_buffer_ = (char  [8])p;
  p_local._4_4_ = idx;
  pFStack_10 = this;
  (anonymous_namespace)::FileVars_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)this->file_,(FileDescriptor *)&this->options_,in_RCX
            );
  io::Printer::
  WithVars<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>,void,void>
            ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1039:28)>
              *)local_30,p,&local_50);
  absl::lts_20240722::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_hash_map(&local_50);
  GenerateSourceIncludes(this,(Printer *)v.storage_.callback_buffer_);
  GenerateSourcePrelude(this,(Printer *)v.storage_.callback_buffer_);
  bVar2 = IsAnyMessage(this->file_);
  if (bVar2) {
    anon_unknown_19::MuteWuninitialized((Printer *)v.storage_.callback_buffer_);
  }
  CrossFileReferences::CrossFileReferences((CrossFileReferences *)local_a8);
  pvVar3 = std::
           vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ::operator[](&this->message_generators_,(long)p_local._4_4_);
  pMVar4 = std::
           unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
           ::operator->(pvVar3);
  d = MessageGenerator::descriptor(pMVar4);
  ns.name_stack_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ForEachField<false,google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage(int,google::protobuf::io::Printer*)::__0>
            (d,(anon_class_16_2_3fe543fb *)
               &ns.name_stack_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  GenerateInternalForwardDeclarations
            (this,(CrossFileReferences *)local_a8,(Printer *)v.storage_.callback_buffer_);
  Namespace_abi_cxx11_(&local_110,(cpp *)this->file_,(FileDescriptor *)&this->options_,in_RCX);
  local_f0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_110);
  acVar1 = v.storage_.callback_buffer_;
  io::Printer::SourceLocation::current();
  NamespaceOpener::NamespaceOpener((NamespaceOpener *)local_e0,local_f0._0_8_,local_f0._8_8_,acVar1)
  ;
  std::__cxx11::string::~string((string *)&local_110);
  acVar1 = v.storage_.callback_buffer_;
  local_331 = 1;
  local_2b0 = &local_2a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"defaults",&local_2d1);
  local_2f0.idx = (int *)((long)&p_local + 4);
  local_2f0.p = (Printer **)v.storage_.callback_buffer_;
  local_2f0.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage(int,google::protobuf::io::Printer*)::__1>
            (&local_2a8,&local_2d0,&local_2f0);
  local_2b0 = &local_1f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"class_methods",&local_311);
  local_330.idx = (int *)((long)&p_local + 4);
  local_330.p = (Printer **)v.storage_.callback_buffer_;
  local_330.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage(int,google::protobuf::io::Printer*)::__2>
            (&local_1f0,&local_310,&local_330);
  local_331 = 0;
  local_138 = &local_2a8;
  local_130 = 2;
  v_00._M_len = 2;
  v_00._M_array = local_138;
  absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_128._M_local_buf,v_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_348,
             "\n          $defaults$;\n\n          $class_methods$;\n\n          // @@protoc_insertion_point(namespace_scope)\n        "
            );
  io::Printer::SourceLocation::current();
  google::protobuf::io::Printer::Emit
            (acVar1,local_128._M_allocated_capacity,local_128._8_8_,local_348._M_len,
             local_348._M_str);
  local_400 = (Sub *)&local_138;
  do {
    local_400 = local_400 + -1;
    io::Printer::Sub::~Sub(local_400);
  } while (local_400 != &local_2a8);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_e0);
  local_388 = ProtobufNamespace(&this->options_);
  acVar1 = v.storage_.callback_buffer_;
  io::Printer::SourceLocation::current();
  NamespaceOpener::NamespaceOpener
            ((NamespaceOpener *)local_378,local_388._M_len,local_388._M_str,acVar1);
  pvVar3 = std::
           vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ::operator[](&this->message_generators_,(long)p_local._4_4_);
  pMVar4 = std::
           unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
           ::operator->(pvVar3);
  MessageGenerator::GenerateSourceInProto2Namespace(pMVar4,(Printer *)v.storage_.callback_buffer_);
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_378);
  bVar2 = IsAnyMessage(this->file_);
  if (bVar2) {
    anon_unknown_19::UnmuteWuninitialized((Printer *)v.storage_.callback_buffer_);
  }
  acVar1 = v.storage_.callback_buffer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3a0,"\n    // @@protoc_insertion_point(global_scope)\n  ");
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)acVar1,local_3a0._M_len,local_3a0._M_str);
  CrossFileReferences::~CrossFileReferences((CrossFileReferences *)local_a8);
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/printer.h:1039:28)>
  ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1039:28)>
              *)local_30);
  return;
}

Assistant:

void FileGenerator::GenerateSourceForMessage(int idx, io::Printer* p) {
  auto v = p->WithVars(FileVars(file_, options_));

  GenerateSourceIncludes(p);
  GenerateSourcePrelude(p);

  if (IsAnyMessage(file_)) {
    MuteWuninitialized(p);
  }

  CrossFileReferences refs;
  ForEachField<false>(message_generators_[idx]->descriptor(),
                      [this, &refs](const FieldDescriptor* field) {
                        GetCrossFileReferencesForField(field, &refs);
                      });

  GenerateInternalForwardDeclarations(refs, p);

  {
    NamespaceOpener ns(Namespace(file_, options_), p);
    p->Emit(
        {
            {"defaults", [&] { GenerateSourceDefaultInstance(idx, p); }},
            {"class_methods",
             [&] { message_generators_[idx]->GenerateClassMethods(p); }},
        },
        R"cc(
          $defaults$;

          $class_methods$;

          // @@protoc_insertion_point(namespace_scope)
        )cc");
  }

  {
    NamespaceOpener proto_ns(ProtobufNamespace(options_), p);
    message_generators_[idx]->GenerateSourceInProto2Namespace(p);
  }

  if (IsAnyMessage(file_)) {
    UnmuteWuninitialized(p);
  }

  p->Emit(R"cc(
    // @@protoc_insertion_point(global_scope)
  )cc");
}